

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_encode_utils.cpp
# Opt level: O0

string * encode_compute_md5_abi_cxx11_(string *__return_storage_ptr__,char *buf,int len)

{
  uchar *dst;
  allocator<char> local_451;
  mbedtls_md_info_t *local_450;
  mbedtls_md_info_t *md5_md;
  mbedtls_md_context_t ctx;
  uchar local_428 [8];
  char encoded [512];
  char output [512];
  size_t output_len;
  int len_local;
  char *buf_local;
  
  dst = (uchar *)(encoded + 0x1f8);
  memset(dst,0,0x200);
  memset(local_428,0,0x200);
  md5_md = (mbedtls_md_info_t *)0x0;
  ctx.md_info = (mbedtls_md_info_t *)0x0;
  ctx.md_ctx = (void *)0x0;
  local_450 = mbedtls_md_info_from_type(MBEDTLS_MD_MD5);
  mbedtls_md_init_ctx((mbedtls_md_context_t *)&md5_md,local_450);
  mbedtls_md_update((mbedtls_md_context_t *)&md5_md,(uchar *)buf,(long)len);
  mbedtls_md_finish((mbedtls_md_context_t *)&md5_md,local_428);
  mbedtls_base64_encode(dst,0x200,(size_t *)(output + 0x1f8),local_428,0x10);
  mbedtls_md_free((mbedtls_md_context_t *)&md5_md);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)dst,&local_451);
  std::allocator<char>::~allocator(&local_451);
  return __return_storage_ptr__;
}

Assistant:

std::string encode_compute_md5(char* buf, int len) {
  size_t output_len;
  char output[512] = {};
  char encoded[512] = {};
  mbedtls_md_context_t ctx= {};
  const mbedtls_md_info_t* md5_md = mbedtls_md_info_from_type(MBEDTLS_MD_MD5);

  mbedtls_md_init_ctx(&ctx, md5_md);
  mbedtls_md_update(&ctx, (const unsigned char*)buf, len);
  mbedtls_md_finish(&ctx, (unsigned char*)encoded);

  mbedtls_base64_encode((unsigned char*)output, sizeof(output), &output_len, (const unsigned char*)encoded, 16);
  mbedtls_md_free(&ctx);
  return output;
}